

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

uint8 * google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray
                  (string *str,uint8 *target)

{
  bool bVar1;
  uint uVar2;
  LogMessage *other;
  uint uVar3;
  size_t __n;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (str->_M_string_length >> 0x20 != 0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x319);
    other = internal::LogMessage::operator<<
                      (&local_58,"CHECK failed: (str.size()) <= (kuint32max): ");
    internal::LogFinisher::operator=(&local_59,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  uVar3 = (uint)str->_M_string_length;
  uVar2 = uVar3;
  if (0x7f < uVar3) {
    do {
      *target = (byte)uVar3 | 0x80;
      uVar2 = uVar3 >> 7;
      target = target + 1;
      bVar1 = 0x3fff < uVar3;
      uVar3 = uVar2;
    } while (bVar1);
  }
  *target = (byte)uVar2;
  __n = (size_t)(int)str->_M_string_length;
  memcpy(target + 1,(str->_M_dataplus)._M_p,__n);
  return target + __n + 1;
}

Assistant:

uint8* CodedOutputStream::WriteStringWithSizeToArray(const string& str,
                                                     uint8* target) {
  GOOGLE_DCHECK_LE(str.size(), kuint32max);
  target = WriteVarint32ToArray(str.size(), target);
  return WriteStringToArray(str, target);
}